

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsLink.cpp
# Opt level: O3

bool Js::ASMLink::CheckFFI(ScriptContext *scriptContext,AsmJsModuleInfo *info,Var foreign)

{
  TypeId typeId;
  code *pcVar1;
  bool bVar2;
  RecyclableObject *pRVar3;
  undefined4 *puVar4;
  
  if ((info->mFunctionImportCount == 0) && (info->mVarImportCount == 0)) {
    return true;
  }
  if (foreign == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsLink.cpp"
                                ,0x2c,"(foreign)","foreign");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    bVar2 = VarIs<Js::RecyclableObject>((Var)0x0);
    if (!bVar2) goto LAB_00944cd5;
  }
  else if ((ulong)foreign >> 0x30 != 0) {
LAB_00944cd5:
    AsmJSCompiler::OutputError(scriptContext,L"Asm.js Runtime Error : FFI is not an object");
    return false;
  }
  pRVar3 = VarTo<Js::RecyclableObject>(foreign);
  typeId = ((pRVar3->type).ptr)->typeId;
  bVar2 = StaticType::Is(typeId);
  if (typeId == TypeIds_Proxy || bVar2) {
    AsmJSCompiler::OutputError(scriptContext,L"Asm.js Runtime Error : FFI is not an object");
  }
  return typeId != TypeIds_Proxy && !bVar2;
}

Assistant:

bool ASMLink::CheckFFI(ScriptContext* scriptContext, AsmJsModuleInfo* info, const Var foreign)
    {
        if (info->GetFunctionImportCount() == 0 && info->GetVarImportCount() == 0)
        {
            return true;
        }
        Assert(foreign);
        if (!VarIs<RecyclableObject>(foreign))
        {
            AsmJSCompiler::OutputError(scriptContext, _u("Asm.js Runtime Error : FFI is not an object"));
            return false;
        }
        TypeId foreignObjType = VarTo<RecyclableObject>(foreign)->GetTypeId();
        if (StaticType::Is(foreignObjType) || TypeIds_Proxy == foreignObjType)
        {
            AsmJSCompiler::OutputError(scriptContext, _u("Asm.js Runtime Error : FFI is not an object"));
            return false;
        }
        return true;
    }